

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::map_into_range<long>
               (Read<signed_char> *a_data,LO begin,LO end,Write<signed_char> *b_data,Int width)

{
  Alloc *pAVar1;
  ulong uVar2;
  type f;
  
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  if ((end - begin) * width == (int)(uVar2 >> 3)) {
    f.begin = begin;
    f.width = width;
    Write<long>::Write((Write<int> *)&f.b_data,(Write<int> *)b_data);
    Write<long>::Write((Write<int> *)&f.a_data,(Write<int> *)a_data);
    parallel_for<Omega_h::map_into_range<long>(Omega_h::Read<long>,int,int,Omega_h::Write<long>,int)::_lambda(int)_1_>
              (end - begin,&f,"map_into_range");
    map_into_range<long>(Omega_h::Read<long>,int,int,Omega_h::Write<long>,int)::{lambda(int)#1}::
    ~Write((_lambda_int__1_ *)&f);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x32);
}

Assistant:

void map_into_range(
    Read<T> a_data, LO begin, LO end, Write<T> b_data, Int width) {
  auto na = end - begin;
  OMEGA_H_CHECK(a_data.size() == na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = begin + a;
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] = a_data[a * width + j];
    }
  };
  parallel_for(na, f, "map_into_range");
}